

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_interface.h
# Opt level: O2

return_type * __thiscall
ezy::features::result_interface<ezy::features::result_adapter>::
impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
::and_then<____C_A_T_C_H____T_E_S_T____28()::__27&>
          (return_type *__return_storage_ptr__,
          impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
          *this,anon_class_1_0_00000001 *fn)

{
  variant_alternative_t<1UL,_variant<int,_basic_string<char>_>_> *pvVar1;
  uint *puVar2;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined1 local_18;
  
  if (this[0x20] ==
      (impl<ezy::strong_type<std::variant<int,std::__cxx11::string>,void,ezy::features::result_like_continuation>>
       )0x0) {
    puVar2 = (uint *)result_adapter<std::variant<int,std::__cxx11::string>>::
                     get_success<std::variant<int,std::__cxx11::string>>
                               ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this);
    if ((*puVar2 & 1) == 0) {
      local_38._M_first._M_storage = (_Uninitialized<int,_true>)((int)*puVar2 >> 1);
      local_18 = 0;
    }
    else {
      std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
      _Variant_storage<1ul,char_const(&)[5]>
                ((_Variant_storage<false,int,std::__cxx11::string> *)&local_38,"oops");
    }
  }
  else {
    pvVar1 = result_adapter<std::variant<int,std::__cxx11::string>>::
             get_error<std::variant<int,std::__cxx11::string>>
                       ((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this);
    std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
    _Variant_storage<1ul,std::__cxx11::string>
              ((_Variant_storage<false,int,std::__cxx11::string> *)&local_38,pvVar1);
  }
  std::__detail::__variant::
  _Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Move_ctor_base((_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)__return_storage_ptr__,
                    (_Move_ctor_base<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_38._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_38._M_first);
  return __return_storage_ptr__;
}

Assistant:

constexpr decltype(auto) and_then(Fn&& fn) &&
      {
        return _impl::and_then(static_cast<T&&>(*this), std::forward<Fn>(fn));
      }